

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

void N_VConst_Serial(sunrealtype c,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = *z->content;
  lVar1 = *(long *)((long)z->content + 0x10);
  lVar3 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar3;
  }
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *(sunrealtype *)(lVar1 + lVar3 * 8) = c;
  }
  return;
}

Assistant:

void N_VConst_Serial(sunrealtype c, N_Vector z)
{
  sunindextype i, N;
  sunrealtype* zd;

  zd = NULL;

  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = c; }

  return;
}